

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O0

void jsimd_h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  _func_void_JDIMENSION_JSAMPIMAGE_JDIMENSION_JSAMPARRAY *sse2fct;
  _func_void_JDIMENSION_JSAMPIMAGE_JDIMENSION_JSAMPARRAY *avx2fct;
  code *local_30;
  code *local_28;
  
  switch(*(undefined4 *)(in_RDI + 0x40)) {
  case 6:
    local_28 = jsimd_h2v1_extrgb_merged_upsample_avx2;
    local_30 = jsimd_h2v1_extrgb_merged_upsample_sse2;
    break;
  case 7:
  case 0xc:
    local_28 = jsimd_h2v1_extrgbx_merged_upsample_avx2;
    local_30 = jsimd_h2v1_extrgbx_merged_upsample_sse2;
    break;
  case 8:
    local_28 = jsimd_h2v1_extbgr_merged_upsample_avx2;
    local_30 = jsimd_h2v1_extbgr_merged_upsample_sse2;
    break;
  case 9:
  case 0xd:
    local_28 = jsimd_h2v1_extbgrx_merged_upsample_avx2;
    local_30 = jsimd_h2v1_extbgrx_merged_upsample_sse2;
    break;
  case 10:
  case 0xe:
    local_28 = jsimd_h2v1_extxbgr_merged_upsample_avx2;
    local_30 = jsimd_h2v1_extxbgr_merged_upsample_sse2;
    break;
  case 0xb:
  case 0xf:
    local_28 = jsimd_h2v1_extxrgb_merged_upsample_avx2;
    local_30 = jsimd_h2v1_extxrgb_merged_upsample_sse2;
    break;
  default:
    local_28 = jsimd_h2v1_merged_upsample_avx2;
    local_30 = jsimd_h2v1_merged_upsample_sse2;
  }
  if ((simd_support & 0x80) == 0) {
    (*local_30)(*(undefined4 *)(in_RDI + 0x88),in_RSI,in_EDX,in_RCX);
  }
  else {
    (*local_28)(*(undefined4 *)(in_RDI + 0x88),in_RSI,in_EDX,in_RCX);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v1_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                           JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  void (*avx2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY);
  void (*sse2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY);

  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    avx2fct = jsimd_h2v1_extrgb_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_extrgb_merged_upsample_sse2;
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    avx2fct = jsimd_h2v1_extrgbx_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_extrgbx_merged_upsample_sse2;
    break;
  case JCS_EXT_BGR:
    avx2fct = jsimd_h2v1_extbgr_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_extbgr_merged_upsample_sse2;
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    avx2fct = jsimd_h2v1_extbgrx_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_extbgrx_merged_upsample_sse2;
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    avx2fct = jsimd_h2v1_extxbgr_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_extxbgr_merged_upsample_sse2;
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    avx2fct = jsimd_h2v1_extxrgb_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_extxrgb_merged_upsample_sse2;
    break;
  default:
    avx2fct = jsimd_h2v1_merged_upsample_avx2;
    sse2fct = jsimd_h2v1_merged_upsample_sse2;
    break;
  }

  if (simd_support & JSIMD_AVX2)
    avx2fct(cinfo->output_width, input_buf, in_row_group_ctr, output_buf);
  else
    sse2fct(cinfo->output_width, input_buf, in_row_group_ctr, output_buf);
}